

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::anon_unknown_8::LogFileObject::Flush(LogFileObject *this)

{
  time_point local_18;
  
  std::mutex::lock(&this->mutex_);
  local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  FlushUnlocked(this,&local_18);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void LogFileObject::Flush() {
  std::lock_guard<std::mutex> l{mutex_};
  FlushUnlocked(std::chrono::system_clock::now());
}